

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_set_standard_lookup.c
# Opt level: O3

void cleanup(EVP_PKEY_CTX *ctx)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    free(*(void **)(ctx + lVar1));
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x7f0);
  free(ctx);
  return;
}

Assistant:

static void
cleanup(void *data)
{
	struct name_cache *cache = (struct name_cache *)data;
	size_t i;

	if (cache != NULL) {
		for (i = 0; i < cache->size; i++) {
			if (cache->cache[i].name != NULL &&
			    cache->cache[i].name != NO_NAME)
				free((void *)(uintptr_t)cache->cache[i].name);
		}
		free(cache->buff);
		free(cache);
	}
}